

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O1

void group_tables(ecs_world_t *world,ecs_query_t *query)

{
  uint uVar1;
  ecs_matched_table_t *peVar2;
  ulong uVar3;
  ecs_matched_table_t *table;
  
  if (query->group_table != (ecs_rank_type_action_t)0x0) {
    uVar1 = ecs_vector_count(query->tables);
    peVar2 = (ecs_matched_table_t *)_ecs_vector_first(query->tables,0x50,0x10);
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
      do {
        group_table(world,query,peVar2);
        peVar2 = peVar2 + 1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    uVar1 = ecs_vector_count(query->empty_tables);
    peVar2 = (ecs_matched_table_t *)_ecs_vector_first(query->empty_tables,0x50,0x10);
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
      do {
        group_table(world,query,peVar2);
        peVar2 = peVar2 + 1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
  }
  return;
}

Assistant:

static
void group_tables(
    ecs_world_t *world,
    ecs_query_t *query)
{
    if (query->group_table) {
        ecs_vector_each(query->tables, ecs_matched_table_t, table, {
            group_table(world, query, table);
        });

        ecs_vector_each(query->empty_tables, ecs_matched_table_t, table, {
            group_table(world, query, table);
        });              
    }
}